

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

size_t EntityRelationTask::predict_relation
                 (search *sch,example *ex,v_array<unsigned_long> *predictions,ptag my_tag,bool isLdf
                 )

{
  uint uVar1;
  float *pfVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  action aVar6;
  predictor *ppVar7;
  undefined4 uVar8;
  size_t j;
  ulong uVar9;
  unsigned_long ent1_id;
  unsigned_long ent2_id;
  long lVar10;
  ulong uVar11;
  float loss;
  char type;
  int id2;
  int id1;
  v_array<unsigned_int> constrained_relation_labels;
  v_array<unsigned_int> star_labels;
  predictor local_118;
  
  pfVar2 = (float *)sch->task_data;
  decode_tag(ex->tag,&type,&id1,&id2);
  constrained_relation_labels.end_array = (uint *)0x0;
  constrained_relation_labels.erase_count = 0;
  constrained_relation_labels._begin = (uint *)0x0;
  constrained_relation_labels._end = (uint *)0x0;
  if (*(char *)(pfVar2 + 4) == '\x01') {
    ent1_id = predictions->_begin[id1];
    if (ent1_id != 0) {
      ent2_id = predictions->_begin[id2];
      if (ent2_id == 0) {
        ent1_id = 0;
      }
      goto LAB_0022a903;
    }
  }
  ent1_id = 0;
  ent2_id = 0;
LAB_0022a903:
  lVar10 = 0;
  for (uVar9 = 0; lVar3 = *(long *)(pfVar2 + 0xe),
      uVar9 < (ulong)(*(long *)(pfVar2 + 0x10) - lVar3 >> 2); uVar9 = uVar9 + 1) {
    if (((*(char *)(pfVar2 + 4) != '\x01') || (ent1_id == 0)) ||
       (bVar4 = check_constraints(ent1_id,ent2_id,(ulong)*(uint *)(lVar3 + lVar10)), bVar4)) {
      v_array<unsigned_int>::push_back(&constrained_relation_labels,(uint *)(lVar3 + lVar10));
    }
    lVar10 = lVar10 + 4;
  }
  if (*(char *)((long)pfVar2 + 0x11) == '\0') {
    if (isLdf) {
      lVar10 = 0;
      uVar11 = 0;
      for (uVar9 = 0;
          uVar9 < (ulong)((long)constrained_relation_labels._end -
                          (long)constrained_relation_labels._begin >> 2); uVar9 = uVar9 + 1) {
        VW::copy_example_data(false,(example *)(*(long *)(pfVar2 + 0x1a) + lVar10),ex);
        update_example_indicies
                  (false,(example *)(*(long *)(pfVar2 + 0x1a) + lVar10),0x1b90d09,
                   (ulong)constrained_relation_labels._begin[uVar9] * 0x49be95);
        lVar3 = *(long *)(pfVar2 + 0x1a);
        **(undefined4 **)(lVar3 + 0x6828 + lVar10) = 0;
        *(uint *)(*(long *)(lVar3 + 0x6828 + lVar10) + 4) =
             constrained_relation_labels._begin[uVar9];
        *(undefined4 *)(*(long *)(lVar3 + 0x6828 + lVar10) + 8) = 0;
        *(undefined4 *)(*(long *)(lVar3 + 0x6828 + lVar10) + 0xc) = 0;
        if (constrained_relation_labels._begin[uVar9] == (ex->l).multi.label) {
          uVar11 = uVar9 & 0xffffffff;
        }
        lVar10 = lVar10 + 0x68d0;
      }
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar7 = Search::predictor::set_input
                         (&local_118,*(example **)(pfVar2 + 0x1a),
                          (long)constrained_relation_labels._end -
                          (long)constrained_relation_labels._begin >> 2);
      ppVar7 = Search::predictor::set_oracle(ppVar7,(action)uVar11);
      ppVar7 = Search::predictor::set_learner_id(ppVar7,2);
      aVar6 = Search::predictor::predict(ppVar7);
      Search::predictor::~predictor(&local_118);
      uVar5 = constrained_relation_labels._begin[aVar6];
    }
    else {
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar7 = Search::predictor::set_input(&local_118,ex);
      ppVar7 = Search::predictor::set_oracle(ppVar7,(ex->l).multi.label);
      ppVar7 = Search::predictor::set_allowed(ppVar7,&constrained_relation_labels);
      ppVar7 = Search::predictor::set_learner_id(ppVar7,1);
      uVar5 = Search::predictor::predict(ppVar7);
      Search::predictor::~predictor(&local_118);
    }
  }
  else {
    star_labels.end_array = (uint *)0x0;
    star_labels.erase_count = 0;
    star_labels._begin = (uint *)0x0;
    star_labels._end = (uint *)0x0;
    v_array<unsigned_int>::push_back(&star_labels,(uint *)&(ex->l).empty);
    uVar8._0_1_ = true;
    uVar8._1_3_ = 0;
    local_118._0_4_ = uVar8;
    v_array<unsigned_int>::push_back(&star_labels,(uint *)&local_118);
    local_118._0_4_ = uVar8;
    v_array<unsigned_int>::push_back(&constrained_relation_labels,(uint *)&local_118);
    Search::predictor::predictor(&local_118,sch,my_tag);
    ppVar7 = Search::predictor::set_input(&local_118,ex);
    ppVar7 = Search::predictor::set_oracle(ppVar7,&star_labels);
    ppVar7 = Search::predictor::set_allowed(ppVar7,&constrained_relation_labels);
    ppVar7 = Search::predictor::set_learner_id(ppVar7,2);
    ppVar7 = Search::predictor::add_condition(ppVar7,id1,'a');
    ppVar7 = Search::predictor::add_condition(ppVar7,id2,'b');
    uVar5 = Search::predictor::predict(ppVar7);
    Search::predictor::~predictor(&local_118);
    constrained_relation_labels._end = constrained_relation_labels._end + -1;
  }
  if (uVar5 == 0xb) {
    loss = pfVar2[3];
  }
  else {
    uVar1 = (ex->l).multi.label;
    loss = 0.0;
    if (uVar5 != uVar1) {
      if (uVar1 == 10) {
        loss = *pfVar2;
      }
      else {
        loss = pfVar2[2];
      }
    }
  }
  Search::search::loss(sch,loss);
  v_array<unsigned_int>::delete_v(&constrained_relation_labels);
  return (ulong)uVar5;
}

Assistant:

size_t predict_relation(Search::search& sch, example* ex, v_array<size_t>& predictions, ptag my_tag, bool isLdf = false)
{
  char type;
  int id1, id2;
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t hist[2];
  decode_tag(ex->tag, type, id1, id2);
  v_array<uint32_t> constrained_relation_labels = v_init<uint32_t>();
  if (my_task_data->constraints && predictions[id1] != 0 && predictions[id2] != 0)
  {
    hist[0] = predictions[id1];
    hist[1] = predictions[id2];
  }
  else
  {
    hist[0] = 0;
    hist[1] = 0;
  }
  for (size_t j = 0; j < my_task_data->y_allowed_relation.size(); j++)
  {
    if (!my_task_data->constraints || hist[0] == (size_t)0 ||
        check_constraints(hist[0], hist[1], my_task_data->y_allowed_relation[j]))
      constrained_relation_labels.push_back(my_task_data->y_allowed_relation[j]);
  }

  size_t prediction;
  if (my_task_data->allow_skip)
  {
    v_array<uint32_t> star_labels = v_init<uint32_t>();
    star_labels.push_back(ex->l.multi.label);
    star_labels.push_back(LABEL_SKIP);
    constrained_relation_labels.push_back(LABEL_SKIP);
    prediction = Search::predictor(sch, my_tag)
                     .set_input(*ex)
                     .set_oracle(star_labels)
                     .set_allowed(constrained_relation_labels)
                     .set_learner_id(2)
                     .add_condition(id1, 'a')
                     .add_condition(id2, 'b')
                     .predict();
    constrained_relation_labels.pop();
  }
  else
  {
    if (isLdf)
    {
      int correct_label = 0;  // if correct label is not in the set, use the first one
      for (size_t a = 0; a < constrained_relation_labels.size(); a++)
      {
        VW::copy_example_data(false, &my_task_data->ldf_relation[a], ex);
        update_example_indicies(
            true, &my_task_data->ldf_relation[a], 28904713, 4832917 * (uint64_t)(constrained_relation_labels[a]));
        CS::label& lab = my_task_data->ldf_relation[a].l.cs;
        lab.costs[0].x = 0.f;
        lab.costs[0].class_index = constrained_relation_labels[a];
        lab.costs[0].partial_prediction = 0.f;
        lab.costs[0].wap_value = 0.f;
        if (constrained_relation_labels[a] == ex->l.multi.label)
        {
          correct_label = (int)a;
        }
      }
      size_t pred_pos = Search::predictor(sch, my_tag)
                            .set_input(my_task_data->ldf_relation, constrained_relation_labels.size())
                            .set_oracle(correct_label)
                            .set_learner_id(2)
                            .predict();
      prediction = constrained_relation_labels[pred_pos];
    }
    else
    {
      prediction = Search::predictor(sch, my_tag)
                       .set_input(*ex)
                       .set_oracle(ex->l.multi.label)
                       .set_allowed(constrained_relation_labels)
                       .set_learner_id(1)
                       .predict();
    }
  }

  float loss = 0.0;
  if (prediction == LABEL_SKIP)
  {
    loss = my_task_data->skip_cost;
  }
  else if (prediction != ex->l.multi.label)
  {
    if (ex->l.multi.label == R_NONE)
    {
      loss = my_task_data->relation_none_cost;
    }
    else
    {
      loss = my_task_data->relation_cost;
    }
  }
  sch.loss(loss);
  constrained_relation_labels.delete_v();
  return prediction;
}